

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_bmnz_v_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  fpr_t *pfVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  uVar5 = pfVar1->fs[1];
  uVar6 = pfVar1->fs[2];
  uVar7 = pfVar1->fs[3];
  pfVar2 = (env->active_fpu).fpr + wt;
  uVar8 = pfVar2->fs[1];
  uVar9 = pfVar2->fs[2];
  uVar10 = pfVar2->fs[3];
  pfVar3 = (env->active_fpu).fpr + ws;
  uVar11 = pfVar3->fs[1];
  uVar12 = pfVar3->fs[2];
  uVar13 = pfVar3->fs[3];
  pfVar4 = (env->active_fpu).fpr + wd;
  pfVar4->fs[0] = ~pfVar2->fs[0] & pfVar1->fs[0] | pfVar3->fs[0] & pfVar2->fs[0];
  pfVar4->fs[1] = ~uVar8 & uVar5 | uVar11 & uVar8;
  pfVar4->fs[2] = ~uVar9 & uVar6 | uVar12 & uVar9;
  pfVar4->fs[3] = ~uVar10 & uVar7 | uVar13 & uVar10;
  return;
}

Assistant:

void helper_msa_bmnz_v(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0] = UNSIGNED(                                                     \
        ((pwd->d[0] & (~pwt->d[0])) | (pws->d[0] & pwt->d[0])), DF_DOUBLE);
    pwd->d[1] = UNSIGNED(                                                     \
        ((pwd->d[1] & (~pwt->d[1])) | (pws->d[1] & pwt->d[1])), DF_DOUBLE);
}